

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint getNumColorChannels(LodePNGColorType colortype)

{
  switch(colortype) {
  case LCT_GREY:
  case LCT_PALETTE:
    return 1;
  default:
    return 0;
  case LCT_RGB:
    return 3;
  case LCT_GREY_ALPHA:
    return 2;
  case LCT_RGBA:
    return 4;
  }
}

Assistant:

static unsigned getNumColorChannels(LodePNGColorType colortype) {
  switch(colortype) {
    case LCT_GREY: return 1;
    case LCT_RGB: return 3;
    case LCT_PALETTE: return 1;
    case LCT_GREY_ALPHA: return 2;
    case LCT_RGBA: return 4;
    case LCT_MAX_OCTET_VALUE: return 0; /* invalid color type */
    default: return 0; /*invalid color type*/
  }
}